

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

ktx_error_code_e ktxPrintInfoForStdioStream(FILE *stdioStream)

{
  FILE *in_RDI;
  ktxStream stream;
  ktx_error_code_e result;
  ktxStream local_80;
  uint in_stack_ffffffffffffffe8;
  ktx_error_code_e local_4;
  
  if (in_RDI == (FILE *)0x0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    local_4 = ktxFileStream_construct(&local_80,in_RDI,false);
    if (local_4 == KTX_SUCCESS) {
      local_4 = ktxPrintInfoForStream((ktxStream *)(ulong)in_stack_ffffffffffffffe8);
    }
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxPrintInfoForStdioStream(FILE* stdioStream)
{
    KTX_error_code result;
    ktxStream stream;

    if (stdioStream == NULL)
        return KTX_INVALID_VALUE;

    result = ktxFileStream_construct(&stream, stdioStream, KTX_FALSE);
    if (result == KTX_SUCCESS)
        result = ktxPrintInfoForStream(&stream);
    return result;
}